

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindData
          (UnblindParameter *__return_storage_ptr__,ConfidentialNonce *nonce,Privkey *blinding_key,
          ByteData *rangeproof,ConfidentialValue *value_commitment,Script *extra,
          ConfidentialAssetId *asset)

{
  pointer *this;
  uchar *pub_key;
  size_type pub_key_len;
  uchar *priv_key;
  size_type priv_key_len;
  uchar *proof;
  size_type proof_len;
  uchar *commitment;
  size_type commitment_len;
  uchar *extra_00;
  string *message;
  uchar *generator;
  UnblindParameter *this_00;
  uchar *asset_out_00;
  size_type asset_out_len;
  uchar *abf_out_00;
  size_type abf_out_len;
  uchar *vbf_out_00;
  size_type vbf_out_len;
  undefined8 uVar1;
  Amount AVar2;
  allocator_type *in_stack_fffffffffffffb80;
  size_type in_stack_fffffffffffffb88;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb90;
  Amount local_310;
  ConfidentialValue local_300;
  ByteData256 local_2d8;
  BlindFactor local_2c0;
  ByteData256 local_2a0;
  BlindFactor local_288;
  ByteData local_268;
  ConfidentialAssetId local_250;
  undefined1 local_223;
  undefined1 local_222;
  allocator local_221;
  string local_220 [32];
  CfdSourceLocation local_200;
  int local_1e4;
  uint64_t uStack_1e0;
  int ret;
  uint64_t value_out;
  undefined1 local_1d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  undefined1 local_1b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  undefined1 local_190 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  undefined1 local_160 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_bytes;
  undefined1 local_100 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> blinding_key_bytes;
  ByteData local_90;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  Script *extra_local;
  ConfidentialValue *value_commitment_local;
  ByteData *rangeproof_local;
  Privkey *blinding_key_local;
  ConfidentialNonce *nonce_local;
  UnblindParameter *result;
  
  nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)extra;
  ConfidentialNonce::GetData(&local_90,nonce);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,&local_90);
  ByteData::~ByteData((ByteData *)0x4a6896);
  Privkey::GetData((ByteData *)
                   &rangeproof_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,blinding_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,
                     (ByteData *)
                     &rangeproof_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x4a68c9);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &commitment_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,rangeproof);
  ConfidentialValue::GetData
            ((ByteData *)
             &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,value_commitment);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,
                     (ByteData *)
                     &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x4a690e);
  Script::GetData((ByteData *)
                  &entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (Script *)
                  nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,
                     (ByteData *)
                     &entropy_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x4a6941);
  ConfidentialAssetId::GetData
            ((ByteData *)
             &abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,asset);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160,
                     (ByteData *)
                     &abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x4a6974);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4a6987);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4a69ad);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4a69c0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4a69e6);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4a69f9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4a6a1f);
  uStack_1e0 = 0;
  pub_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  pub_key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  priv_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  priv_key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  this = &commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage;
  proof = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  proof_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  commitment = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
  commitment_len =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
  extra_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
  message = (string *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
  generator = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160);
  this_00 = (UnblindParameter *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160);
  asset_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a6b38);
  asset_out_len =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  abf_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a6b61);
  abf_out_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190);
  vbf_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4a6b8e);
  vbf_out_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
  local_1e4 = wally_asset_unblind(pub_key,pub_key_len,priv_key,priv_key_len,proof,proof_len,
                                  commitment,commitment_len,extra_00,(size_t)message,generator,
                                  (size_t)this_00,asset_out_00,asset_out_len,abf_out_00,abf_out_len,
                                  vbf_out_00,vbf_out_len,&stack0xfffffffffffffe20);
  error_code = (CfdError)((ulong)generator >> 0x20);
  if (local_1e4 == 0) {
    local_223 = 0;
    UnblindParameter::UnblindParameter(this_00);
    ByteData::ByteData(&local_268,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0
                      );
    ConfidentialAssetId::ConfidentialAssetId(&local_250,&local_268);
    ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_250);
    ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x4a6f9f);
    ByteData::~ByteData((ByteData *)0x4a6fab);
    ByteData256::ByteData256
              (&local_2a0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_190);
    BlindFactor::BlindFactor(&local_288,&local_2a0);
    BlindFactor::operator=(&__return_storage_ptr__->abf,&local_288);
    BlindFactor::~BlindFactor((BlindFactor *)0x4a6ffa);
    ByteData256::~ByteData256((ByteData256 *)0x4a7006);
    ByteData256::ByteData256
              (&local_2d8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
    BlindFactor::BlindFactor(&local_2c0,&local_2d8);
    BlindFactor::operator=(&__return_storage_ptr__->vbf,&local_2c0);
    BlindFactor::~BlindFactor((BlindFactor *)0x4a7055);
    ByteData256::~ByteData256((ByteData256 *)0x4a7061);
    AVar2 = Amount::CreateBySatoshiAmount(uStack_1e0);
    local_310.amount_ = AVar2.amount_;
    local_310.ignore_check_ = AVar2.ignore_check_;
    ConfidentialValue::ConfidentialValue(&local_300,&local_310);
    ConfidentialValue::operator=(&__return_storage_ptr__->value,&local_300);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4a70ea);
    local_223 = 1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    return __return_storage_ptr__;
  }
  local_200.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_200.filename = local_200.filename + 1;
  local_200.line = 0xb99;
  local_200.funcname = "CalculateUnblindData";
  logger::warn<int&>(&local_200,"wally_asset_unblind NG[{}].",&local_1e4);
  local_222 = 1;
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_220,"unblind confidential data error.",&local_221);
  CfdException::CfdException((CfdException *)this_00,error_code,message);
  local_222 = 0;
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindData(
    const ConfidentialNonce &nonce, const Privkey &blinding_key,
    const ByteData &rangeproof, const ConfidentialValue &value_commitment,
    const Script &extra, const ConfidentialAssetId &asset) {
  const std::vector<uint8_t> nonce_bytes = nonce.GetData().GetBytes();
  const std::vector<uint8_t> blinding_key_bytes =
      blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  const std::vector<uint8_t> extra_bytes = extra.GetData().GetBytes();
  const std::vector<uint8_t> entropy_bytes = asset.GetData().GetBytes();
  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  int ret = wally_asset_unblind(
      nonce_bytes.data(), nonce_bytes.size(), blinding_key_bytes.data(),
      blinding_key_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      entropy_bytes.data(), entropy_bytes.size(), asset_out.data(),
      asset_out.size(), abf_out.data(), abf_out.size(), vbf_out.data(),
      vbf_out.size(), &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));

  return result;
}